

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

QStringList * __thiscall
MakefileGenerator::escapeFilePaths
          (QStringList *__return_storage_ptr__,MakefileGenerator *this,QStringList *paths)

{
  int i;
  ulong uVar1;
  long lVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < (ulong)(paths->d).size; uVar1 = uVar1 + 1) {
    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
              (&local_50,this,(long)&(((paths->d).ptr)->d).d + lVar2);
    QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    lVar2 = lVar2 + 0x18;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList
MakefileGenerator::escapeFilePaths(const QStringList &paths) const
{
    QStringList ret;
    for(int i = 0; i < paths.size(); ++i)
        ret.append(escapeFilePath(paths.at(i)));
    return ret;
}